

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_declare_value
          (irGenerator *this,string *name,SymbolKind kind,int id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *inits,localArrayInitType initType,
          int len)

{
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  __type_conflict _Var1;
  int iVar2;
  mapped_type *pmVar3;
  irGenerator *this_00;
  element_type *peVar4;
  undefined4 extraout_var_00;
  int *piVar5;
  undefined4 extraout_var_01;
  int in_EDX;
  string *in_RSI;
  int in_R9D;
  int in_stack_00000008;
  RightVal right;
  RightVal value_1;
  RightVal size_1;
  RightVal nitems;
  RightVal size;
  RightVal value;
  Variable variable;
  Variable variable_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> varNameRef;
  string varName;
  bool is_memory;
  SharedTyPtr ty;
  GlobalValue globalValue;
  undefined4 in_stack_fffffffffffff4c8;
  uint32_t in_stack_fffffffffffff4cc;
  undefined4 in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4d4;
  undefined1 in_stack_fffffffffffff4d5;
  undefined1 in_stack_fffffffffffff4d6;
  undefined1 in_stack_fffffffffffff4d7;
  ConstValue *in_stack_fffffffffffff4d8;
  _Optional_payload_base<int> in_stack_fffffffffffff4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f8;
  allocator<char> *in_stack_fffffffffffff500;
  key_type *in_stack_fffffffffffff508;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff510;
  key_type *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff518;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff520;
  undefined8 in_stack_fffffffffffff528;
  uint32_t id_00;
  string *in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff53c;
  Variable *in_stack_fffffffffffff558;
  uint32_t in_stack_fffffffffffff564;
  string *in_stack_fffffffffffff568;
  irGenerator *in_stack_fffffffffffff570;
  undefined1 ***local_a48;
  undefined1 ***local_a18;
  undefined1 ***local_9b0;
  undefined8 in_stack_fffffffffffff658;
  undefined1 uVar6;
  LeftVal *in_stack_fffffffffffff660;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *params;
  string *in_stack_fffffffffffff668;
  string *funcName;
  irGenerator *in_stack_fffffffffffff670;
  SymbolKind SVar7;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  irGenerator *in_stack_fffffffffffff680;
  key_type local_890;
  key_type *local_868;
  size_type local_860;
  allocator<char> local_839;
  string local_838 [32];
  string local_818 [36];
  undefined8 local_7f4;
  int local_7ec;
  undefined8 **local_7b8;
  undefined1 **local_7b0 [5];
  undefined1 local_788 [40];
  undefined1 local_760 [40];
  undefined8 **local_738;
  undefined8 local_730;
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [32];
  undefined4 local_6c0;
  undefined8 **local_6b8;
  undefined1 **local_6b0 [5];
  undefined8 **local_688;
  undefined8 local_680;
  allocator<char> local_659;
  string local_658 [32];
  string local_638 [36];
  undefined8 local_614;
  int local_60c;
  undefined1 local_589;
  undefined8 **local_588;
  undefined1 **local_580 [5];
  undefined1 local_558 [40];
  undefined1 local_530 [40];
  undefined8 **local_508;
  undefined8 local_500;
  undefined1 local_4d9 [40];
  undefined1 local_4b1 [33];
  undefined4 local_490;
  irGenerator *local_48c;
  int local_484;
  string local_430 [112];
  string local_3c0 [112];
  string local_350 [32];
  string local_330 [32];
  string local_310 [87];
  undefined1 local_2b9;
  undefined1 local_291;
  string local_270 [128];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [48];
  string local_180 [39];
  undefined1 local_159;
  string local_148 [32];
  string local_128 [40];
  optional<int> local_100 [27];
  int local_24;
  int local_14;
  undefined4 extraout_var;
  
  id_00 = (uint32_t)((ulong)in_stack_fffffffffffff528 >> 0x20);
  local_24 = in_R9D;
  local_14 = in_EDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)CONCAT17(in_stack_fffffffffffff4d7,
                     CONCAT16(in_stack_fffffffffffff4d6,
                              CONCAT15(in_stack_fffffffffffff4d5,
                                       CONCAT14(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0)
                                      ))));
  _Var1 = std::operator==(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  if (_Var1) {
    arm::ConstValue::ConstValue
              ((ConstValue *)
               CONCAT17(in_stack_fffffffffffff4d7,
                        CONCAT16(in_stack_fffffffffffff4d6,
                                 CONCAT15(in_stack_fffffffffffff4d5,
                                          CONCAT14(in_stack_fffffffffffff4d4,
                                                   in_stack_fffffffffffff4d0)))));
    if (in_stack_00000008 == 0) {
      arm::ConstValue::ConstValue
                ((ConstValue *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 in_stack_fffffffffffff4cc);
      arm::ConstValue::operator=
                ((ConstValue *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (ConstValue *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      arm::ConstValue::~ConstValue((ConstValue *)0x25d6d4);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_fffffffffffff520,in_stack_fffffffffffff518);
      std::optional<int>::optional(local_100);
      arm::ConstValue::ConstValue
                (in_stack_fffffffffffff4d8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (optional<int>)in_stack_fffffffffffff4e0);
      arm::ConstValue::operator=
                ((ConstValue *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (ConstValue *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      arm::ConstValue::~ConstValue((ConstValue *)0x25d77f);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff4e0);
    }
    std::__cxx11::string::string(local_148,in_RSI);
    getVarName((irGenerator *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
               in_stack_fffffffffffff530,id_00);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
                  *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    arm::ConstValue::operator=
              ((ConstValue *)
               CONCAT17(in_stack_fffffffffffff4d7,
                        CONCAT16(in_stack_fffffffffffff4d6,
                                 CONCAT15(in_stack_fffffffffffff4d5,
                                          CONCAT14(in_stack_fffffffffffff4d4,
                                                   in_stack_fffffffffffff4d0)))),
               (ConstValue *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    arm::ConstValue::~ConstValue((ConstValue *)0x25d885);
  }
  else {
    std::shared_ptr<mir::types::Ty>::shared_ptr((shared_ptr<mir::types::Ty> *)0x25d8ed);
    std::__cxx11::string::string(local_180);
    if (local_14 == 0) {
      operator_new(8);
      mir::types::IntTy::IntTy
                ((IntTy *)CONCAT17(in_stack_fffffffffffff4d7,
                                   CONCAT16(in_stack_fffffffffffff4d6,
                                            CONCAT15(in_stack_fffffffffffff4d5,
                                                     CONCAT14(in_stack_fffffffffffff4d4,
                                                              in_stack_fffffffffffff4d0)))));
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (IntTy *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      std::shared_ptr<mir::types::Ty>::operator=
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (shared_ptr<mir::types::Ty> *)
                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25d991);
      local_159 = 0;
    }
    else if (local_14 == 2) {
      if ((local_24 == 1) || (local_24 == 2)) {
        std::__cxx11::string::string(local_1f0,in_RSI);
        getVarName((irGenerator *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                   in_stack_fffffffffffff530,id_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4d8,
                       (char *)CONCAT17(in_stack_fffffffffffff4d7,
                                        CONCAT16(in_stack_fffffffffffff4d6,
                                                 CONCAT15(in_stack_fffffffffffff4d5,
                                                          CONCAT14(in_stack_fffffffffffff4d4,
                                                                   in_stack_fffffffffffff4d0)))));
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string(local_1f0);
        mir::types::new_int_ty();
        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                  ((shared_ptr<mir::types::Ty> *)
                   CONCAT17(in_stack_fffffffffffff4d7,
                            CONCAT16(in_stack_fffffffffffff4d6,
                                     CONCAT15(in_stack_fffffffffffff4d5,
                                              CONCAT14(in_stack_fffffffffffff4d4,
                                                       in_stack_fffffffffffff4d0)))),
                   (shared_ptr<mir::types::IntTy> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        mir::types::new_array_ty
                  ((SharedTyPtr *)in_stack_fffffffffffff4d8,
                   CONCAT13(in_stack_fffffffffffff4d7,
                            CONCAT12(in_stack_fffffffffffff4d6,
                                     CONCAT11(in_stack_fffffffffffff4d5,in_stack_fffffffffffff4d4)))
                  );
        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::ArrayTy,void>
                  ((shared_ptr<mir::types::Ty> *)
                   CONCAT17(in_stack_fffffffffffff4d7,
                            CONCAT16(in_stack_fffffffffffff4d6,
                                     CONCAT15(in_stack_fffffffffffff4d5,
                                              CONCAT14(in_stack_fffffffffffff4d4,
                                                       in_stack_fffffffffffff4d0)))),
                   (shared_ptr<mir::types::ArrayTy> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        mir::inst::Variable::Variable
                  ((Variable *)in_stack_fffffffffffff4e0,(SharedTyPtr *)in_stack_fffffffffffff4d8,
                   (bool)in_stack_fffffffffffff4d7,(bool)in_stack_fffffffffffff4d6,
                   (bool)in_stack_fffffffffffff4d5);
        std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25db05);
        std::shared_ptr<mir::types::ArrayTy>::~shared_ptr
                  ((shared_ptr<mir::types::ArrayTy> *)0x25db12);
        std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25db1f);
        std::shared_ptr<mir::types::IntTy>::~shared_ptr((shared_ptr<mir::types::IntTy> *)0x25db2c);
        std::__cxx11::string::string(local_270,local_1b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff4d7,
                           CONCAT16(in_stack_fffffffffffff4d6,
                                    CONCAT15(in_stack_fffffffffffff4d5,
                                             CONCAT14(in_stack_fffffffffffff4d4,
                                                      in_stack_fffffffffffff4d0)))));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                      *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        insertLocalValue(in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                         in_stack_fffffffffffff564,in_stack_fffffffffffff558);
        std::__cxx11::string::~string(local_270);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff4d7,
                           CONCAT16(in_stack_fffffffffffff4d6,
                                    CONCAT15(in_stack_fffffffffffff4d5,
                                             CONCAT14(in_stack_fffffffffffff4d4,
                                                      in_stack_fffffffffffff4d0)))));
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                               *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        pmVar3->_nowLocalValueId = pmVar3->_nowLocalValueId + 1;
        mir::inst::Variable::~Variable((Variable *)0x25dc16);
        std::__cxx11::string::~string(local_1b0);
      }
      operator_new(0x18);
      local_291 = 1;
      operator_new(8);
      mir::types::IntTy::IntTy
                ((IntTy *)CONCAT17(in_stack_fffffffffffff4d7,
                                   CONCAT16(in_stack_fffffffffffff4d6,
                                            CONCAT15(in_stack_fffffffffffff4d5,
                                                     CONCAT14(in_stack_fffffffffffff4d4,
                                                              in_stack_fffffffffffff4d0)))));
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (IntTy *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      mir::types::PtrTy::PtrTy
                ((PtrTy *)in_stack_fffffffffffff4f0,(SharedTyPtr *)in_stack_fffffffffffff4e8);
      local_291 = 0;
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (PtrTy *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      std::shared_ptr<mir::types::Ty>::operator=
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (shared_ptr<mir::types::Ty> *)
                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25ddee);
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25ddfb);
      local_159 = 0;
    }
    else if (local_14 == 4) {
      operator_new(0x18);
      local_2b9 = 1;
      operator_new(8);
      mir::types::IntTy::IntTy
                ((IntTy *)CONCAT17(in_stack_fffffffffffff4d7,
                                   CONCAT16(in_stack_fffffffffffff4d6,
                                            CONCAT15(in_stack_fffffffffffff4d5,
                                                     CONCAT14(in_stack_fffffffffffff4d4,
                                                              in_stack_fffffffffffff4d0)))));
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (IntTy *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      mir::types::PtrTy::PtrTy
                ((PtrTy *)in_stack_fffffffffffff4f0,(SharedTyPtr *)in_stack_fffffffffffff4e8);
      local_2b9 = 0;
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (PtrTy *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      std::shared_ptr<mir::types::Ty>::operator=
                ((shared_ptr<mir::types::Ty> *)
                 CONCAT17(in_stack_fffffffffffff4d7,
                          CONCAT16(in_stack_fffffffffffff4d6,
                                   CONCAT15(in_stack_fffffffffffff4d5,
                                            CONCAT14(in_stack_fffffffffffff4d4,
                                                     in_stack_fffffffffffff4d0)))),
                 (shared_ptr<mir::types::Ty> *)
                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25df38);
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25df45);
      local_159 = 0;
    }
    std::shared_ptr<mir::types::Ty>::shared_ptr
              ((shared_ptr<mir::types::Ty> *)
               CONCAT17(in_stack_fffffffffffff4d7,
                        CONCAT16(in_stack_fffffffffffff4d6,
                                 CONCAT15(in_stack_fffffffffffff4d5,
                                          CONCAT14(in_stack_fffffffffffff4d4,
                                                   in_stack_fffffffffffff4d0)))),
               (shared_ptr<mir::types::Ty> *)
               CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
    mir::inst::Variable::Variable
              ((Variable *)in_stack_fffffffffffff4e0,(SharedTyPtr *)in_stack_fffffffffffff4d8,
               (bool)in_stack_fffffffffffff4d7,(bool)in_stack_fffffffffffff4d6,
               (bool)in_stack_fffffffffffff4d5);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25e028);
    std::__cxx11::string::string(local_330,in_RSI);
    getVarName((irGenerator *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
               in_stack_fffffffffffff530,id_00);
    std::__cxx11::string::operator=(local_180,local_310);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::string(local_350,local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff4d7,
                       CONCAT16(in_stack_fffffffffffff4d6,
                                CONCAT15(in_stack_fffffffffffff4d5,
                                         CONCAT14(in_stack_fffffffffffff4d4,
                                                  in_stack_fffffffffffff4d0)))));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                  *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    insertLocalValue(in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff564,
                     in_stack_fffffffffffff558);
    std::__cxx11::string::~string(local_350);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff4d7,
                       CONCAT16(in_stack_fffffffffffff4d6,
                                CONCAT15(in_stack_fffffffffffff4d5,
                                         CONCAT14(in_stack_fffffffffffff4d4,
                                                  in_stack_fffffffffffff4d0)))));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                           *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    uVar6 = (undefined1)((ulong)in_stack_fffffffffffff658 >> 0x38);
    pmVar3->_nowLocalValueId = pmVar3->_nowLocalValueId + 1;
    if (local_14 == 2) {
      switch(local_24) {
      case 1:
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        std::operator+(in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0);
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        ir_ref(in_stack_fffffffffffff670,(LeftVal *)in_stack_fffffffffffff668,
               in_stack_fffffffffffff660,(bool)uVar6);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25e2d1);
        std::__cxx11::string::~string(local_3c0);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25e2eb);
        break;
      case 2:
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        std::operator+(in_stack_fffffffffffff4f8,(char *)in_stack_fffffffffffff4f0);
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        ir_ref(in_stack_fffffffffffff670,(LeftVal *)in_stack_fffffffffffff668,
               in_stack_fffffffffffff660,(bool)uVar6);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25e3c9);
        std::__cxx11::string::~string(local_430);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25e3e3);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x25e3f0);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x25e3fd);
        peVar4 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x25e418);
        iVar2 = (*(peVar4->super_Displayable)._vptr_Displayable[3])();
        this_00 = (irGenerator *)CONCAT44(extraout_var,iVar2);
        local_48c = this_00;
        piVar5 = std::optional<int>::value
                           ((optional<int> *)
                            CONCAT17(in_stack_fffffffffffff4d7,
                                     CONCAT16(in_stack_fffffffffffff4d6,
                                              CONCAT15(in_stack_fffffffffffff4d5,
                                                       CONCAT14(in_stack_fffffffffffff4d4,
                                                                in_stack_fffffffffffff4d0)))));
        local_484 = in_stack_00000008 * *piVar5;
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        SVar7 = (SymbolKind)((ulong)piVar5 >> 0x20);
        local_490 = 0;
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        funcName = (string *)local_4b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff510,(char *)in_stack_fffffffffffff508,
                   in_stack_fffffffffffff500);
        params = (vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_4d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff510,(char *)in_stack_fffffffffffff508,
                   in_stack_fffffffffffff500);
        local_588 = local_580;
        std::variant<int,int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_588 = (undefined8 **)local_558;
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4d7,
                              CONCAT16(in_stack_fffffffffffff4d6,
                                       CONCAT15(in_stack_fffffffffffff4d5,
                                                CONCAT14(in_stack_fffffffffffff4d4,
                                                         in_stack_fffffffffffff4d0)))),
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_588 = (undefined8 **)local_530;
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4d7,
                              CONCAT16(in_stack_fffffffffffff4d6,
                                       CONCAT15(in_stack_fffffffffffff4d5,
                                                CONCAT14(in_stack_fffffffffffff4d4,
                                                         in_stack_fffffffffffff4d0)))),
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_508 = local_580;
        local_500 = 3;
        uVar6 = (undefined1)((ulong)&local_589 >> 0x38);
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x25e59d);
        __l._M_len = (size_type)in_stack_fffffffffffff510;
        __l._M_array = (iterator)in_stack_fffffffffffff508;
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff500,__l,(allocator_type *)in_stack_fffffffffffff4f8);
        ir_function_call(this_00,(string *)CONCAT44(in_stack_00000008,in_stack_fffffffffffff678),
                         SVar7,funcName,params,(bool)uVar6);
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff4e0);
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x25e60e);
        local_9b0 = (undefined1 ***)&local_508;
        do {
          local_9b0 = local_9b0 + -5;
          std::
          variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x25e643);
        } while (local_9b0 != local_580);
        std::__cxx11::string::~string((string *)(local_4d9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_4d9);
        std::__cxx11::string::~string((string *)(local_4b1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_4b1);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25e6a1);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25e6ae);
        break;
      case 3:
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x25f07a);
        SVar7 = (SymbolKind)((ulong)in_stack_fffffffffffff670 >> 0x20);
        peVar4 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x25f092);
        iVar2 = (*(peVar4->super_Displayable)._vptr_Displayable[3])();
        local_7f4 = CONCAT44(extraout_var_01,iVar2);
        piVar5 = std::optional<int>::value
                           ((optional<int> *)
                            CONCAT17(in_stack_fffffffffffff4d7,
                                     CONCAT16(in_stack_fffffffffffff4d6,
                                              CONCAT15(in_stack_fffffffffffff4d5,
                                                       CONCAT14(in_stack_fffffffffffff4d4,
                                                                in_stack_fffffffffffff4d0)))));
        local_7ec = in_stack_00000008 * *piVar5;
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        std::__cxx11::string::string(local_818,local_180);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff510,(char *)in_stack_fffffffffffff508,
                   in_stack_fffffffffffff500);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4d7,
                              CONCAT16(in_stack_fffffffffffff4d6,
                                       CONCAT15(in_stack_fffffffffffff4d5,
                                                CONCAT14(in_stack_fffffffffffff4d4,
                                                         in_stack_fffffffffffff4d0)))),
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_868 = &local_890;
        local_860 = 1;
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x25f183);
        __l_02._M_len = (size_type)in_stack_fffffffffffff510;
        __l_02._M_array = (iterator)in_stack_fffffffffffff508;
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff500,__l_02,(allocator_type *)in_stack_fffffffffffff4f8);
        ir_function_call(in_stack_fffffffffffff680,
                         (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                         SVar7,in_stack_fffffffffffff668,
                         (vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff660,(bool)uVar6);
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff4e0);
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x25f1f3);
        this_01 = &local_890;
        __k = (key_type *)&local_868;
        do {
          __k = (key_type *)((long)&__k[-2].field_2 + 8);
          std::
          variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x25f21c);
        } while (__k != this_01);
        std::__cxx11::string::~string(local_838);
        std::allocator<char>::~allocator(&local_839);
        std::__cxx11::string::~string(local_818);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff4d7,
                           CONCAT16(in_stack_fffffffffffff4d6,
                                    CONCAT15(in_stack_fffffffffffff4d5,
                                             CONCAT14(in_stack_fffffffffffff4d4,
                                                      in_stack_fffffffffffff4d0)))));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                      *)this_01,__k);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff4e0,(value_type *)in_stack_fffffffffffff4d8);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25f2b2);
        break;
      case 4:
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x25e8b8);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x25e8c5);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x25e8d2);
        peVar4 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x25e8ed);
        iVar2 = (*(peVar4->super_Displayable)._vptr_Displayable[3])();
        local_614 = CONCAT44(extraout_var_00,iVar2);
        piVar5 = std::optional<int>::value
                           ((optional<int> *)
                            CONCAT17(in_stack_fffffffffffff4d7,
                                     CONCAT16(in_stack_fffffffffffff4d6,
                                              CONCAT15(in_stack_fffffffffffff4d5,
                                                       CONCAT14(in_stack_fffffffffffff4d4,
                                                                in_stack_fffffffffffff4d0)))));
        local_60c = in_stack_00000008 * *piVar5;
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        std::__cxx11::string::string(local_638,local_180);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff510,(char *)in_stack_fffffffffffff508,
                   in_stack_fffffffffffff500);
        local_6b8 = local_6b0;
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4d7,
                              CONCAT16(in_stack_fffffffffffff4d6,
                                       CONCAT15(in_stack_fffffffffffff4d5,
                                                CONCAT14(in_stack_fffffffffffff4d4,
                                                         in_stack_fffffffffffff4d0)))),
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_688 = local_6b0;
        local_680 = 1;
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x25e9f6);
        __l_00._M_len = (size_type)in_stack_fffffffffffff510;
        __l_00._M_array = (iterator)in_stack_fffffffffffff508;
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff500,__l_00,(allocator_type *)in_stack_fffffffffffff4f8);
        ir_function_call(in_stack_fffffffffffff680,
                         (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                         (SymbolKind)((ulong)in_stack_fffffffffffff670 >> 0x20),
                         in_stack_fffffffffffff668,
                         (vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff660,
                         SUB81((ulong)in_stack_fffffffffffff658 >> 0x38,0));
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff4e0);
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x25ea69);
        local_a18 = (undefined1 ***)&local_688;
        do {
          local_a18 = local_a18 + -5;
          std::
          variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x25ea9e);
          SVar7 = (SymbolKind)((ulong)in_stack_fffffffffffff670 >> 0x20);
          uVar6 = (undefined1)((ulong)in_stack_fffffffffffff658 >> 0x38);
        } while (local_a18 != local_6b0);
        std::__cxx11::string::~string(local_658);
        std::allocator<char>::~allocator(&local_659);
        std::__cxx11::string::~string(local_638);
        local_6c0 = 0;
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (int *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff510,(char *)in_stack_fffffffffffff508,
                   in_stack_fffffffffffff500);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff510,(char *)in_stack_fffffffffffff508,
                   in_stack_fffffffffffff500);
        local_7b8 = local_7b0;
        std::variant<int,int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff4d7,
                               CONCAT16(in_stack_fffffffffffff4d6,
                                        CONCAT15(in_stack_fffffffffffff4d5,
                                                 CONCAT14(in_stack_fffffffffffff4d4,
                                                          in_stack_fffffffffffff4d0)))),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_7b8 = (undefined8 **)local_788;
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4d7,
                              CONCAT16(in_stack_fffffffffffff4d6,
                                       CONCAT15(in_stack_fffffffffffff4d5,
                                                CONCAT14(in_stack_fffffffffffff4d4,
                                                         in_stack_fffffffffffff4d0)))),
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_7b8 = (undefined8 **)local_760;
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4d7,
                              CONCAT16(in_stack_fffffffffffff4d6,
                                       CONCAT15(in_stack_fffffffffffff4d5,
                                                CONCAT14(in_stack_fffffffffffff4d4,
                                                         in_stack_fffffffffffff4d0)))),
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        local_738 = local_7b0;
        local_730 = 3;
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x25ebf8);
        __l_01._M_len = (size_type)in_stack_fffffffffffff510;
        __l_01._M_array = (iterator)in_stack_fffffffffffff508;
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff500,__l_01,(allocator_type *)in_stack_fffffffffffff4f8);
        ir_function_call(in_stack_fffffffffffff680,
                         (string *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                         SVar7,in_stack_fffffffffffff668,
                         (vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff660,(bool)uVar6);
        std::
        vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff4e0);
        std::
        allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x25ec69);
        local_a48 = (undefined1 ***)&local_738;
        do {
          local_a48 = local_a48 + -5;
          std::
          variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x25ec9e);
        } while (local_a48 != local_7b0);
        std::__cxx11::string::~string(local_708);
        std::allocator<char>::~allocator(&local_709);
        std::__cxx11::string::~string(local_6e0);
        std::allocator<char>::~allocator(&local_6e1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff4d7,
                           CONCAT16(in_stack_fffffffffffff4d6,
                                    CONCAT15(in_stack_fffffffffffff4d5,
                                             CONCAT14(in_stack_fffffffffffff4d4,
                                                      in_stack_fffffffffffff4d0)))));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                      *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff4e0,(value_type *)in_stack_fffffffffffff4d8);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25ed56);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25ed63);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x25ed70);
      }
    }
    mir::inst::Variable::~Variable((Variable *)0x25f410);
    std::__cxx11::string::~string(local_180);
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25f42a);
  }
  return;
}

Assistant:

void irGenerator::ir_declare_value(string name, symbol::SymbolKind kind, int id,
                                   std::vector<uint32_t> inits,
                                   localArrayInitType initType, int len) {
  if (_funcStack.back() == _GlobalInitFuncName) {
    GlobalValue globalValue;
    if (len == 0) {
      globalValue = GlobalValue(0);
    } else {
      globalValue = GlobalValue(inits);
    }
    _package.global_values[getVarName(name, id)] = globalValue;
  } else {
    SharedTyPtr ty;
    bool is_memory;
    string varName;

    switch (kind) {
      case front::symbol::SymbolKind::INT:
        ty = SharedTyPtr(new IntTy());
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Array:
        if (initType == localArrayInitType::Small ||
            initType == localArrayInitType::SmallInit) {
          auto varNameRef = getVarName(name, id) + "_$array";

          Variable variable(
              mir::types::new_array_ty(mir::types::new_int_ty(), len), true,
              false, false);
          insertLocalValue(
              varNameRef,
              _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
              variable);
          _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;
        }
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Ptr:
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      default:
        break;
    }
    Variable variable(ty, is_memory, false);
    varName = getVarName(name, id);

    insertLocalValue(varName,
                     _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
                     variable);
    _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;

    if (kind == symbol::SymbolKind::Array) {
      switch (initType) {
        case localArrayInitType::Small: {
          ir_ref(varName, varName + "_$array", true);
          break;
        }
        case localArrayInitType::SmallInit: {
          ir_ref(varName, varName + "_$array", true);
          RightVal value;
          RightVal size;
          size.emplace<0>(len * ty->size().value());
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          break;
        }
        case localArrayInitType::BigInit: {
          RightVal nitems;
          RightVal size;
          RightVal value;

          size.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {size},
                           true);
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        case localArrayInitType::BigNoInit: {
          RightVal right;
          right.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {right},
                           true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        default:
          break;
      }
    }
  }
}